

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcObjectDefinition::~IfcObjectDefinition(IfcObjectDefinition *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  pointer pcVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  
  *(undefined8 *)&this[-1].super_IfcRoot.field_0x28 = 0x816b38;
  *(undefined8 *)
   &(this->super_IfcRoot).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.field_0x10 =
       0x816b60;
  puVar2 = *(undefined1 **)&this[-1].super_IfcRoot.field_0x88;
  puVar1 = &this[-1].super_IfcRoot.field_0x98;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  pcVar3 = this[-1].super_IfcRoot.Description.ptr._M_dataplus._M_p;
  paVar4 = &this[-1].super_IfcRoot.Description.ptr.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar4) {
    operator_delete(pcVar3,paVar4->_M_allocated_capacity + 1);
  }
  pcVar3 = this[-1].super_IfcRoot.Name.ptr._M_dataplus._M_p;
  paVar4 = &this[-1].super_IfcRoot.Name.ptr.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar4) {
    operator_delete(pcVar3,paVar4->_M_allocated_capacity + 1);
  }
  operator_delete(&this[-1].super_IfcRoot.field_0x28,0xb0);
  return;
}

Assistant:

IfcObjectDefinition() : Object("IfcObjectDefinition") {}